

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

void __thiscall
Js::JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
          (AutoCatchHandlerExists *this,ScriptContext *scriptContext,bool isPromiseHandled)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x2d,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00aa1f8b;
    *puVar4 = 0;
  }
  pTVar1 = scriptContext->threadContext;
  this->m_threadContext = pTVar1;
  if (pTVar1 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x2f,"(m_threadContext)","m_threadContext");
    if (!bVar3) {
LAB_00aa1f8b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pTVar1 = this->m_threadContext;
  this->m_previousCatchHandlerExists = pTVar1->hasCatchHandler;
  pTVar1->hasCatchHandler = isPromiseHandled;
  this->m_previousCatchHandlerToUserCodeStatus = pTVar1->hasCatchHandlerToUserCode;
  bVar3 = ScriptContext::IsScriptContextInDebugMode(scriptContext);
  if (bVar3) {
    FetchNonUserCodeStatus(this,scriptContext);
    return;
  }
  return;
}

Assistant:

JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists(ScriptContext* scriptContext, bool isPromiseHandled)
    {
        Assert(scriptContext);
        m_threadContext = scriptContext->GetThreadContext();
        Assert(m_threadContext);
        m_previousCatchHandlerExists = m_threadContext->HasCatchHandler();
        m_threadContext->SetHasCatchHandler(TRUE);

        if (!isPromiseHandled)
        {
            // If this is created from a promise-specific code path, and we don't have a rejection
            // handler on the promise, then we want SetCatchHandler to be false so we report any
            // unhandled exceptions to any detached debuggers.
            m_threadContext->SetHasCatchHandler(false);
        }

        m_previousCatchHandlerToUserCodeStatus = m_threadContext->IsUserCode();
        if (scriptContext->IsScriptContextInDebugMode())
        {
            FetchNonUserCodeStatus(scriptContext);
        }
    }